

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

void rw::copyPal8(uint8 *dst,uint32 dststride,uint8 *src,uint32 srcstride,int32 w,int32 h)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (0 < h) {
    uVar3 = 0;
    uVar5 = 0;
    iVar1 = 0;
    do {
      iVar4 = (int)uVar5;
      uVar6 = (ulong)(uint)w;
      uVar2 = uVar3;
      if (0 < w) {
        do {
          dst[uVar5] = src[uVar2];
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar6 = uVar6 - 1;
          uVar2 = uVar2 + 1;
        } while (uVar6 != 0);
      }
      iVar1 = iVar1 + 1;
      uVar5 = (ulong)(iVar4 + dststride);
      uVar3 = uVar3 + srcstride;
    } while (iVar1 != h);
  }
  return;
}

Assistant:

void
copyPal8(uint8 *dst, uint32 dststride, uint8 *src, uint32 srcstride, int32 w, int32 h)
{
	int32 x, y;
	for(y = 0; y < h; y++)
		for(x = 0; x < w; x++)
			dst[y*dststride + x] = src[y*srcstride + x];
}